

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXTokenizer.cpp
# Opt level: O2

void Assimp::FBX::anon_unknown_3::ProcessDataToken
               (TokenList *output_tokens,char **start,char **end,uint line,uint column,
               TokenType type,bool must_have_token)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  byte *pbVar4;
  byte *pbVar5;
  allocator local_59;
  uint local_58;
  uint local_54;
  string local_50;
  
  pbVar2 = (byte *)*start;
  local_58 = line;
  local_54 = column;
  if (*end == (char *)0x0 || pbVar2 == (byte *)0x0) {
    if (must_have_token) {
      std::__cxx11::string::string
                ((string *)&local_50,"unexpected character, expected data token",&local_59);
      TokenizeError(&local_50,local_58,local_54);
    }
  }
  else {
    pbVar5 = (byte *)(*end + 1);
    bVar3 = false;
    for (pbVar4 = pbVar2; pbVar4 != pbVar5; pbVar4 = pbVar4 + 1) {
      bVar1 = *pbVar4;
      bVar3 = (bool)(bVar3 ^ bVar1 == 0x22);
      if (((!bVar3) && (bVar1 < 0x21)) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        std::__cxx11::string::string((string *)&local_50,"unexpected whitespace in token",&local_59)
        ;
        TokenizeError(&local_50,local_58,local_54);
      }
    }
    if (bVar3) {
      std::__cxx11::string::string((string *)&local_50,"non-terminated double quotes",&local_59);
      TokenizeError(&local_50,local_58,local_54);
    }
    local_50._M_dataplus._M_p = (pointer)operator_new(0x28);
    *(byte **)local_50._M_dataplus._M_p = pbVar2;
    *(byte **)(local_50._M_dataplus._M_p + 8) = pbVar5;
    *(TokenType *)(local_50._M_dataplus._M_p + 0x10) = type;
    *(ulong *)(local_50._M_dataplus._M_p + 0x18) = (ulong)local_58;
    *(uint *)(local_50._M_dataplus._M_p + 0x20) = local_54;
    std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
    emplace_back<Assimp::FBX::Token_const*>
              ((vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *)
               output_tokens,(Token **)&local_50);
  }
  *end = (char *)0x0;
  *start = (char *)0x0;
  return;
}

Assistant:

void ProcessDataToken( TokenList& output_tokens, const char*& start, const char*& end,
                      unsigned int line,
                      unsigned int column,
                      TokenType type = TokenType_DATA,
                      bool must_have_token = false)
{
    if (start && end) {
        // sanity check:
        // tokens should have no whitespace outside quoted text and [start,end] should
        // properly delimit the valid range.
        bool in_double_quotes = false;
        for (const char* c = start; c != end + 1; ++c) {
            if (*c == '\"') {
                in_double_quotes = !in_double_quotes;
            }

            if (!in_double_quotes && IsSpaceOrNewLine(*c)) {
                TokenizeError("unexpected whitespace in token", line, column);
            }
        }

        if (in_double_quotes) {
            TokenizeError("non-terminated double quotes", line, column);
        }

        output_tokens.push_back(new_Token(start,end + 1,type,line,column));
    }
    else if (must_have_token) {
        TokenizeError("unexpected character, expected data token", line, column);
    }

    start = end = NULL;
}